

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example6.cpp
# Opt level: O1

int main(void)

{
  undefined8 *****pppppuVar1;
  undefined8 *****pppppuVar2;
  in_addr_t iVar3;
  int iVar4;
  ostream *poVar5;
  uint uVar6;
  uint16_t destport;
  uint16_t portbase;
  int num;
  string ipstr;
  timespec req;
  RTPSessionParams sessparams;
  RTPUDPv4TransmissionParams transparams;
  timespec rem;
  RTPIPv4Address addr;
  MyRTPSession sess;
  int iStack_1094c;
  char *pcStack_10948;
  undefined8 uStack_10940;
  char cStack_10938;
  undefined7 uStack_10937;
  timespec tStack_10928;
  undefined1 auStack_10918 [128];
  _Alloc_hider _Stack_10898;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_10888;
  RTPLibraryVersion RStack_10870;
  undefined2 uStack_10864;
  undefined8 uStack_10860;
  undefined8 ****ppppuStack_10858;
  undefined8 ****ppppuStack_10850;
  undefined8 uStack_10848;
  undefined1 uStack_10840;
  undefined8 uStack_1083c;
  undefined8 uStack_10834;
  undefined1 uStack_1082c;
  undefined4 uStack_1082b;
  undefined3 uStack_10827;
  undefined5 uStack_10824;
  undefined8 uStack_10818;
  timespec tStack_10810;
  RTPAddress RStack_10800;
  RTPSession RStack_107e8;
  
  jrtplib::RTPSession::RTPSession(&RStack_107e8,(RTPRandom *)0x0,(RTPMemoryManager *)0x0);
  pcStack_10948 = &cStack_10938;
  uStack_10940 = 0;
  cStack_10938 = '\0';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Using version ",0xe);
  RStack_10870 = jrtplib::RTPLibraryVersion::GetVersion();
  jrtplib::RTPLibraryVersion::GetVersionString_abi_cxx11_((string *)auStack_10918,&RStack_10870);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)CONCAT71(auStack_10918._1_7_,auStack_10918[0]),
                      auStack_10918._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((undefined1 *)CONCAT71(auStack_10918._1_7_,auStack_10918[0]) != auStack_10918 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(auStack_10918._1_7_,auStack_10918[0]),
                    auStack_10918._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter local portbase:",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter the destination IP address",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&pcStack_10948);
  iVar3 = inet_addr(pcStack_10948);
  if (iVar3 == 0xffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad IP address specified",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
    std::ostream::put(-0x20);
    iVar4 = -1;
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter the destination port",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of packets you wish to be sent:",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,&iStack_1094c);
    RStack_10870 = (RTPLibraryVersion)ZEXT812(0x13ce70);
    uStack_10848 = 0;
    uStack_10864 = 5000;
    uStack_10860 = 0;
    uStack_10840 = 1;
    uStack_1083c = 0x800000008000;
    uStack_10834 = 0x800000008000;
    uStack_10818 = 0;
    uStack_1082c = 0;
    uStack_1082b = 0;
    uStack_10827 = 0;
    uStack_10824 = 0;
    ppppuStack_10858 = &ppppuStack_10858;
    ppppuStack_10850 = &ppppuStack_10858;
    jrtplib::RTPSessionParams::RTPSessionParams((RTPSessionParams *)auStack_10918);
    auStack_10918._16_8_ = 0x3fb999999999999a;
    auStack_10918[0] = true;
    uStack_1082c = 1;
    iVar4 = jrtplib::RTPSession::Create
                      (&RStack_107e8,(RTPSessionParams *)auStack_10918,
                       (RTPTransmissionParams *)&RStack_10870,IPv4UDPProto);
    checkerror(iVar4);
    RStack_10800._12_4_ =
         iVar3 >> 0x18 | (iVar3 & 0xff0000) >> 8 | (iVar3 & 0xff00) << 8 | iVar3 << 0x18;
    RStack_10800.addresstype = IPv4Address;
    RStack_10800._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013db80;
    iVar4 = jrtplib::RTPSession::AddDestination(&RStack_107e8,&RStack_10800);
    checkerror(iVar4);
    if (0 < iStack_1094c) {
      uVar6 = 0;
      do {
        uVar6 = uVar6 + 1;
        printf("\nSending packet %d/%d\n",(ulong)uVar6);
        iVar4 = jrtplib::RTPSession::SendPacket(&RStack_107e8,"1234567890",10,'\0',false,10);
        checkerror(iVar4);
        iVar4 = jrtplib::RTPSession::Poll(&RStack_107e8);
        checkerror(iVar4);
        tStack_10928.tv_sec = 1;
        tStack_10928.tv_nsec = 0;
        nanosleep(&tStack_10928,&tStack_10810);
      } while ((int)uVar6 < iStack_1094c);
    }
    tStack_10928.tv_sec = 0x4024000000000000;
    jrtplib::RTPSession::BYEDestroy(&RStack_107e8,(RTPTime *)&tStack_10928,(void *)0x0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_10898._M_p != &aStack_10888) {
      operator_delete(_Stack_10898._M_p,aStack_10888._M_allocated_capacity + 1);
    }
    RStack_10870._0_8_ = &PTR__RTPUDPv4TransmissionParams_0013ce70;
    pppppuVar2 = (undefined8 *****)ppppuStack_10858;
    while (pppppuVar2 != &ppppuStack_10858) {
      pppppuVar1 = (undefined8 *****)*pppppuVar2;
      operator_delete(pppppuVar2,0x18);
      pppppuVar2 = pppppuVar1;
    }
    iVar4 = 0;
  }
  if (pcStack_10948 != &cStack_10938) {
    operator_delete(pcStack_10948,CONCAT71(uStack_10937,cStack_10938) + 1);
  }
  jrtplib::RTPSession::~RTPSession(&RStack_107e8);
  return iVar4;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	MyRTPSession sess;
	uint16_t portbase,destport;
	uint32_t destip;
	std::string ipstr;
	int status,i,num;

	std::cout << "Using version " << RTPLibraryVersion::GetVersion().GetVersionString() << std::endl;

	// First, we'll ask for the necessary information
		
	std::cout << "Enter local portbase:" << std::endl;
	std::cin >> portbase;
	std::cout << std::endl;
	
	std::cout << "Enter the destination IP address" << std::endl;
	std::cin >> ipstr;

	destip = inet_addr(ipstr.c_str());
	if (destip == INADDR_NONE)
	{
		std::cerr << "Bad IP address specified" << std::endl;
		return -1;
	}
	
	// The inet_addr function returns a value in network byte order, but
	// we need the IP address in host byte order, so we use a call to
	// ntohl
	destip = ntohl(destip);
	
	std::cout << "Enter the destination port" << std::endl;
	std::cin >> destport;
	
	std::cout << std::endl;
	std::cout << "Number of packets you wish to be sent:" << std::endl;
	std::cin >> num;

	// Now, we'll create a RTP session, set the destination, send some
	// packets and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be sending 10 samples each second, so we'll
	// put the timestamp unit to (1.0/10.0)
	sessparams.SetOwnTimestampUnit(1.0/10.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	
	// Let's also use RTCP multiplexing for this example
	transparams.SetRTCPMultiplexing(true); 

	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	// We're assuming that the destination is also using RTCP multiplexing 
	// ('true' means that the same port will be used for RTCP)
	RTPIPv4Address addr(destip,destport,true); 
	
	status = sess.AddDestination(addr);
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		printf("\nSending packet %d/%d\n",i,num);
		
		// send the packet
		status = sess.SendPacket((void *)"1234567890",10,0,false,10);
		checkerror(status);

		// Either the background thread or the poll function itself will
		// cause the OnValidatedRTPPacket and OnRTCPSDESItem functions to
		// be called, so in this loop there's not much left to do. 
		
#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}